

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  bool bVar1;
  xml_attribute_struct *a_00;
  long *in_RSI;
  xml_allocator *in_RDI;
  xml_allocator *alloc;
  bool local_1;
  
  if ((in_RDI->_root == (xml_memory_page *)0x0) || (*in_RSI == 0)) {
    local_1 = false;
  }
  else {
    bVar1 = impl::anon_unknown_0::is_attribute_of
                      ((xml_attribute_struct *)*in_RSI,(xml_node_struct *)in_RDI->_root);
    if (bVar1) {
      a_00 = (xml_attribute_struct *)
             impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>
                       ((xml_node_struct *)in_RDI->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve((xml_allocator *)a_00);
      if (bVar1) {
        impl::anon_unknown_0::remove_attribute
                  ((xml_attribute_struct *)*in_RSI,(xml_node_struct *)in_RDI->_root);
        impl::anon_unknown_0::destroy_attribute(a_00,in_RDI);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;
		if (!impl::is_attribute_of(a._attr, _root)) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_attribute(a._attr, _root);
		impl::destroy_attribute(a._attr, alloc);

		return true;
	}